

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBase64(EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
                ArrayPtr<const_char> input)

{
  kj kVar1;
  char cVar2;
  byte bVar3;
  byte *__src;
  byte *pbVar4;
  byte *pbVar5;
  kj *pkVar6;
  ulong elementCount;
  ulong uVar7;
  ulong elementCount_00;
  bool bVar8;
  bool bVar9;
  Array<unsigned_char> output;
  Array<unsigned_char> copy;
  
  elementCount = (long)input.ptr * 6 + 7U >> 3;
  uVar7 = 0;
  __src = (byte *)_::HeapArrayDisposer::allocateImpl
                            (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
  pkVar6 = this + (int)input.ptr;
  bVar8 = false;
  pbVar4 = __src;
  while (pbVar5 = pbVar4, this != pkVar6) {
    kVar1 = *this;
    this = this + 1;
    cVar2 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)kVar1];
    bVar8 = (bool)(bVar8 | cVar2 < -1);
    if (-1 < cVar2) {
      *pbVar4 = cVar2 << 2;
      do {
        if (this == pkVar6) {
          bVar8 = true;
          goto LAB_003563c8;
        }
        kVar1 = *this;
        this = this + 1;
        bVar3 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)kVar1];
        bVar8 = (bool)(bVar8 | (char)bVar3 < -1);
      } while ((char)bVar3 < '\0');
      *pbVar4 = *pbVar4 | bVar3 >> 4 & 3;
      pbVar5 = pbVar4 + 1;
      pbVar4[1] = bVar3 << 4;
      do {
        if (this == pkVar6) {
          bVar8 = (bool)(bVar8 | uVar7 == 1);
          goto LAB_003563c8;
        }
        bVar3 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)*this];
        bVar9 = !bVar8;
        bVar8 = true;
        if (bVar9 && -3 < (char)bVar3) {
          if (*this == (kj)0x3d) {
            uVar7 = uVar7 + 1;
            bVar8 = 2 < uVar7;
          }
          else {
            bVar8 = false;
          }
        }
        this = this + 1;
      } while ((char)bVar3 < '\0');
      pbVar4[1] = pbVar4[1] | bVar3 >> 2 & 0xf;
      pbVar5 = pbVar4 + 2;
      pbVar4[2] = bVar3 << 6;
      bVar8 = (bool)(bVar8 | uVar7 != 0);
      do {
        if (this == pkVar6) goto LAB_003563c8;
        bVar3 = (anonymous_namespace)::base64_decode_value(char)::decoding[(byte)*this];
        bVar9 = true;
        if (!bVar8 && -3 < (char)bVar3) {
          if (*this == (kj)0x3d) {
            uVar7 = uVar7 + 1;
            bVar9 = 1 < uVar7;
          }
          else {
            bVar9 = false;
          }
        }
        this = this + 1;
        bVar8 = bVar9;
      } while ((char)bVar3 < '\0');
      bVar8 = (bool)(bVar9 | uVar7 != 0);
      pbVar4[2] = pbVar4[2] | bVar3 & 0x3f;
      pbVar4 = pbVar4 + 3;
    }
  }
LAB_003563c8:
  elementCount_00 = (ulong)((int)pbVar5 - (int)__src);
  pbVar4 = __src;
  uVar7 = elementCount;
  if (elementCount_00 < elementCount) {
    pbVar4 = (byte *)_::HeapArrayDisposer::allocateImpl
                               (1,elementCount_00,elementCount_00,(_func_void_void_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    memcpy(pbVar4,__src,elementCount_00);
    uVar7 = elementCount_00;
    if (__src != (byte *)0x0) {
      _::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,__src,1,elementCount,
                 elementCount,(_func_void_void_ptr *)0x0);
    }
  }
  (__return_storage_ptr__->super_Array<unsigned_char>).ptr = pbVar4;
  (__return_storage_ptr__->super_Array<unsigned_char>).size_ = uVar7;
  (__return_storage_ptr__->super_Array<unsigned_char>).disposer =
       (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  __return_storage_ptr__->hadErrors = bVar8;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeBase64(ArrayPtr<const char> input) {
  base64_decodestate state;

  auto output = heapArray<byte>((input.size() * 6 + 7) / 8);

  size_t n = base64_decode_block(input.begin(), input.size(),
      reinterpret_cast<char*>(output.begin()), &state);

  if (n < output.size()) {
    auto copy = heapArray<byte>(n);
    memcpy(copy.begin(), output.begin(), n);
    output = kj::mv(copy);
  }

  return EncodingResult<Array<byte>>(kj::mv(output), state.hadErrors);
}